

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkqsort.c
# Opt level: O0

void mkqsort(uchar **a,int n,int depth)

{
  byte bVar1;
  uchar *puVar2;
  int iVar3;
  uchar **ppuVar4;
  bool bVar5;
  int local_88;
  long local_80;
  uchar *t;
  uchar **pn;
  uchar **pm;
  uchar **pl;
  uchar **pd;
  uchar **pc;
  uchar **pb;
  uchar **pa;
  int local_20;
  int partval;
  int r;
  int d;
  int depth_local;
  int n_local;
  uchar **a_local;
  
  if (n < 0x14) {
    inssort(a,n,depth);
  }
  else {
    pn = a + n / 2;
    t = (uchar *)(a + (n + -1));
    pm = a;
    if (0x1e < n) {
      iVar3 = n / 8;
      pm = med3func(a,a + iVar3,a + (iVar3 << 1),depth);
      pn = med3func(pn + -(long)iVar3,pn,pn + iVar3,depth);
      t = (uchar *)med3func((uchar **)((long)t + -(long)(iVar3 << 1) * 8),
                            (uchar **)((long)t + -(long)iVar3 * 8),(uchar **)t,depth);
    }
    ppuVar4 = med3func(pm,pn,(uchar **)t,depth);
    puVar2 = *a;
    *a = *ppuVar4;
    *ppuVar4 = puVar2;
    bVar1 = (*a)[depth];
    pc = a + 1;
    pd = a + (long)n + -1;
    pb = pc;
    pl = pd;
    while( true ) {
      while( true ) {
        bVar5 = false;
        if (pc <= pd) {
          local_20 = (uint)(*pc)[depth] - (uint)bVar1;
          bVar5 = local_20 < 1;
        }
        if (!bVar5) break;
        if (local_20 == 0) {
          puVar2 = *pb;
          *pb = *pc;
          *pc = puVar2;
          pb = pb + 1;
        }
        pc = pc + 1;
      }
      while( true ) {
        bVar5 = false;
        if (pc <= pd) {
          local_20 = (uint)(*pd)[depth] - (uint)bVar1;
          bVar5 = -1 < local_20;
        }
        if (!bVar5) break;
        if (local_20 == 0) {
          puVar2 = *pd;
          *pd = *pl;
          *pl = puVar2;
          pl = pl + -1;
        }
        pd = pd + -1;
      }
      if (pd < pc) break;
      puVar2 = *pc;
      *pc = *pd;
      *pd = puVar2;
      pc = pc + 1;
      pd = pd + -1;
    }
    if ((long)pc - (long)pb >> 3 < (long)pb - (long)a >> 3) {
      local_80 = (long)pc - (long)pb;
    }
    else {
      local_80 = (long)pb - (long)a;
    }
    local_80 = local_80 >> 3;
    vecswap2(a,pc + -(long)(int)local_80,(int)local_80);
    if (((long)a + ((long)n * 8 - (long)pl) >> 3) + -1 < (long)pl - (long)pd >> 3) {
      local_88 = (int)((long)a + ((long)n * 8 - (long)pl) >> 3) + -1;
    }
    else {
      local_88 = (int)((long)pl - (long)pd >> 3);
    }
    vecswap2(pc,a + ((long)n - (long)local_88),local_88);
    iVar3 = (int)((long)pc - (long)pb >> 3);
    if (1 < iVar3) {
      mkqsort(a,iVar3,depth);
    }
    if (a[iVar3][depth] != '\0') {
      mkqsort(a + iVar3,
              (int)((long)a + ((((long)pb - (long)a >> 3) * 8 + (long)n * 8) - (long)pl) >> 3) + -1,
              depth + 1);
    }
    iVar3 = (int)((long)pl - (long)pd >> 3);
    if (1 < iVar3) {
      mkqsort(a + ((long)n - (long)iVar3),iVar3,depth);
    }
  }
  return;
}

Assistant:

void mkqsort(unsigned char **a, int n, int depth)
{   int d, r, partval;
    unsigned char **pa, **pb, **pc, **pd, **pl, **pm, **pn, *t;
    if (n < 20) {
        inssort(a, n, depth);
        return;
    }
    pl = a;
    pm = a + (n/2);
    pn = a + (n-1);
    if (n > 30) { /* On big arrays, pseudomedian of 9 */
        d = (n/8);
        pl = med3(pl, pl+d, pl+2*d);
        pm = med3(pm-d, pm, pm+d);
        pn = med3(pn-2*d, pn-d, pn);
    }
    pm = med3(pl, pm, pn);
    swap2(a, pm);
    partval = ptr2char(a);
    pa = pb = a + 1;
    pc = pd = a + n-1;
    for (;;) {
        while (pb <= pc && (r = ptr2char(pb)-partval) <= 0) {
            if (r == 0) { swap2(pa, pb); pa++; }
            pb++;
        }
        while (pb <= pc && (r = ptr2char(pc)-partval) >= 0) {
            if (r == 0) { swap2(pc, pd); pd--; }
            pc--;
       }
        if (pb > pc) break;
        swap2(pb, pc);
        pb++;
        pc--;
    }
    pn = a + n;
    r = min(pa-a, pb-pa);    vecswap2(a,  pb-r, r);
    r = min(pd-pc, pn-pd-1); vecswap2(pb, pn-r, r);
    if ((r = pb-pa) > 1)
        mkqsort(a, r, depth);
    if (ptr2char(a + r) != 0)
        mkqsort(a + r, pa-a + pn-pd-1, depth+1);
    if ((r = pd-pc) > 1)
        mkqsort(a + n-r, r, depth);
}